

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feerate.cpp
# Opt level: O1

CAmount __thiscall CFeeRate::GetFee(CFeeRate *this,uint32_t num_bytes)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  double dVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = this->nSatoshisPerK;
  dVar5 = ceil((double)(long)((ulong)num_bytes * lVar2) / 1000.0);
  uVar4 = (ulong)dVar5;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar2) {
    uVar3 = (ulong)(0 < lVar2);
  }
  if (uVar4 != 0) {
    uVar3 = uVar4;
  }
  if (num_bytes == 0) {
    uVar3 = uVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

CAmount CFeeRate::GetFee(uint32_t num_bytes) const
{
    const int64_t nSize{num_bytes};

    // Be explicit that we're converting from a double to int64_t (CAmount) here.
    // We've previously had issues with the silent double->int64_t conversion.
    CAmount nFee{static_cast<CAmount>(std::ceil(nSatoshisPerK * nSize / 1000.0))};

    if (nFee == 0 && nSize != 0) {
        if (nSatoshisPerK > 0) nFee = CAmount(1);
        if (nSatoshisPerK < 0) nFee = CAmount(-1);
    }

    return nFee;
}